

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qbmphandler.cpp
# Opt level: O0

bool read_dib_body(QDataStream *s,BMP_INFOHDR *bi,qint64 datapos,qint64 startpos,QImage *image)

{
  short sVar1;
  uint uVar2;
  QSize size;
  byte bVar3;
  byte bVar4;
  bool bVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  uint uVar10;
  uint g;
  uint b_00;
  uint a;
  QRgb QVar11;
  QIODevice *pQVar12;
  ulong uVar13;
  long lVar14;
  qsizetype qVar15;
  uchar *__s;
  byte *pbVar16;
  uchar *puVar17;
  ushort *puVar18;
  QRgb *pQVar19;
  void *__dest;
  long in_RCX;
  long in_RDX;
  byte *pbVar20;
  int *in_RSI;
  QDataStream *in_RDI;
  QImage *in_R8;
  long in_FS_OFFSET;
  bool bVar21;
  bool bVar22;
  bool bVar23;
  bool bVar24;
  int y_2;
  uchar *buf_1;
  int c_1;
  uchar *b_3;
  int bpl24;
  uchar *buf24;
  QRgb *end;
  QRgb *p_3;
  uchar *endp_1;
  uchar *p_2;
  int y_1;
  int x_1;
  int i_2;
  uchar *b_1;
  uchar *p_1;
  uchar *endp;
  uchar *p;
  int i_1;
  int c;
  int y;
  int x;
  uchar *buf;
  int buflen;
  uchar *data;
  int bpl;
  int i;
  int rgb_len;
  Format format;
  int depth;
  int ncols;
  bool transp;
  bool bitfields;
  uint alpha_scale;
  uint blue_scale;
  uint green_scale;
  uint red_scale;
  uint alpha_shift;
  uint blue_shift;
  uint green_shift;
  uint red_shift;
  int comp;
  int t;
  int nbits;
  int h;
  int w;
  QIODevice *d;
  char tmp_3;
  quint8 tmp_2;
  quint8 b_2;
  uchar tmp_1;
  quint8 tmp;
  quint8 b;
  uint alpha_mask;
  uint blue_mask;
  uint green_mask;
  uint red_mask;
  uchar rgb [4];
  int in_stack_fffffffffffffe38;
  int in_stack_fffffffffffffe3c;
  QImage *in_stack_fffffffffffffe40;
  int in_stack_fffffffffffffe4c;
  QImage *in_stack_fffffffffffffe50;
  undefined4 in_stack_fffffffffffffe58;
  undefined4 in_stack_fffffffffffffe5c;
  undefined4 in_stack_fffffffffffffe60;
  undefined4 in_stack_fffffffffffffe64;
  Format in_stack_fffffffffffffe68;
  QImage *in_stack_fffffffffffffe70;
  int local_160;
  int local_154;
  uint local_144;
  ushort *local_140;
  Representation in_stack_fffffffffffffec8;
  Representation in_stack_fffffffffffffecc;
  QRgb *local_120;
  uchar *local_110;
  int local_104;
  int local_fc;
  byte *local_f8;
  uchar *local_f0;
  uchar *local_e0;
  uint local_d8;
  int local_d0;
  int local_ac;
  int local_a0;
  int local_9c;
  uint local_94;
  uint local_90;
  uint local_8c;
  uint local_88;
  byte local_84;
  byte local_80;
  byte local_7c;
  byte local_78;
  int local_68;
  bool local_2b;
  byte local_28;
  byte local_25;
  uint local_1c;
  uint local_18;
  uint local_14;
  uint local_10;
  uint local_c;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar12 = QDataStream::device(in_RDI);
  uVar13 = (**(code **)(*(long *)pQVar12 + 0x90))();
  if ((uVar13 & 1) != 0) {
    local_2b = false;
    goto LAB_002852d4;
  }
  uVar2 = in_RSI[1];
  local_68 = in_RSI[2];
  sVar1 = *(short *)((long)in_RSI + 0xe);
  iVar6 = (int)sVar1;
  iVar8 = *in_RSI;
  iVar9 = in_RSI[4];
  local_10 = 0;
  local_14 = 0;
  local_18 = 0;
  local_1c = 0;
  local_78 = 0;
  local_7c = 0;
  local_80 = 0;
  local_84 = 0;
  bVar4 = local_84;
  local_84 = 0;
  bVar3 = local_84;
  local_84 = 0;
  local_88 = 0;
  local_8c = 0;
  local_90 = 0;
  local_94 = 0;
  bVar21 = iVar9 == 3;
  bVar22 = iVar9 == 4;
  uVar13 = (**(code **)(*(long *)pQVar12 + 0x60))();
  if ((uVar13 & 1) == 0) {
    (**(code **)(*(long *)pQVar12 + 0x88))(pQVar12,in_RCX + *in_RSI);
  }
  if (*in_RSI < 0x6c) {
    if ((bVar21 || bVar22) && ((iVar6 == 0x10 || (iVar6 == 0x20)))) {
      lVar14 = QIODevice::read((char *)pQVar12,(longlong)&local_10);
      if (lVar14 != 4) {
        local_2b = false;
        goto LAB_002852d4;
      }
      lVar14 = QIODevice::read((char *)pQVar12,(longlong)&local_14);
      if (lVar14 != 4) {
        local_2b = false;
        goto LAB_002852d4;
      }
      lVar14 = QIODevice::read((char *)pQVar12,(longlong)&local_18);
      if (lVar14 != 4) {
        local_2b = false;
        goto LAB_002852d4;
      }
      if ((iVar9 == 4) &&
         (lVar14 = QIODevice::read((char *)pQVar12,(longlong)&local_1c), lVar14 != 4)) {
        local_2b = false;
        goto LAB_002852d4;
      }
    }
  }
  else {
    local_10 = in_RSI[10];
    local_14 = in_RSI[0xb];
    local_18 = in_RSI[0xc];
    local_1c = in_RSI[0xd];
  }
  bVar23 = true;
  if (((!bVar21 && !bVar22) && (bVar23 = false, iVar9 == 0)) && (bVar23 = false, iVar6 == 0x20)) {
    bVar23 = local_1c == 0xff000000;
  }
  bVar24 = local_1c != 0;
  local_9c = 0;
  if (iVar6 == 1) {
    local_a0 = 1;
  }
  else if ((iVar6 == 4) || (iVar6 == 8)) {
    local_a0 = 8;
  }
  else {
    if (((iVar6 != 0x10) && (iVar6 != 0x18)) && (iVar6 != 0x20)) {
      local_2b = false;
      goto LAB_002852d4;
    }
    local_a0 = 0x20;
  }
  if (local_a0 != 0x20) {
    if (in_RSI[8] == 0) {
      local_160 = 1 << ((byte)sVar1 & 0x1f);
    }
    else {
      local_160 = in_RSI[8];
    }
    local_9c = local_160;
    if ((local_160 < 1) || (0x100 < local_160)) {
      local_2b = false;
      goto LAB_002852d4;
    }
  }
  if (in_RSI[2] < 0) {
    local_68 = -local_68;
  }
  QSize::QSize((QSize *)in_stack_fffffffffffffe40,in_stack_fffffffffffffe3c,
               in_stack_fffffffffffffe38);
  size.ht.m_i = in_stack_fffffffffffffecc.m_i;
  size.wd.m_i = in_stack_fffffffffffffec8.m_i;
  bVar5 = QImageIOHandler::allocateImage
                    (size,in_stack_fffffffffffffe68,
                     (QImage *)CONCAT44(in_stack_fffffffffffffe64,in_stack_fffffffffffffe60));
  if (!bVar5) {
    local_2b = false;
    goto LAB_002852d4;
  }
  if (local_9c < 1) {
    if ((bVar21 || bVar22) && ((iVar6 == 0x10 || (iVar6 == 0x20)))) {
      uVar10 = calc_shift(local_10);
      local_78 = (byte)uVar10;
      if (local_10 >> (local_78 & 0x1f) == 0xffffffff) {
        local_2b = false;
        goto LAB_002852d4;
      }
      local_88 = calc_scale(local_10 >> (local_78 & 0x1f));
      uVar10 = calc_shift(local_14);
      local_7c = (byte)uVar10;
      if (local_14 >> (local_7c & 0x1f) == 0xffffffff) {
        local_2b = false;
        goto LAB_002852d4;
      }
      local_8c = calc_scale(local_14 >> (local_7c & 0x1f));
      uVar10 = calc_shift(local_18);
      local_80 = (byte)uVar10;
      if (local_18 >> (local_80 & 0x1f) == 0xffffffff) {
        local_2b = false;
        goto LAB_002852d4;
      }
      local_90 = calc_scale(local_18 >> (local_80 & 0x1f));
      uVar10 = calc_shift(local_1c);
      local_84 = (byte)uVar10;
      if (local_1c >> (local_84 & 0x1f) == 0xffffffff) {
        local_2b = false;
        goto LAB_002852d4;
      }
      local_94 = calc_scale(local_1c >> (local_84 & 0x1f));
    }
    else {
      if ((iVar9 == 0) && ((iVar6 == 0x18 || (iVar6 == 0x20)))) {
        local_18 = 0xff;
        local_14 = 0xff00;
        local_10 = 0xff0000;
        local_7c = 8;
        local_78 = 0x10;
        local_88 = 0;
        local_8c = 0;
        local_90 = 0;
        local_84 = bVar4;
        if (bVar23 && bVar24) {
          uVar10 = calc_shift(local_1c);
          local_84 = (byte)uVar10;
          if (local_1c >> (local_84 & 0x1f) == 0xffffffff) {
            local_2b = false;
            goto LAB_002852d4;
          }
          local_94 = calc_scale(local_1c >> (local_84 & 0x1f));
        }
      }
      else {
        local_78 = 0;
        local_7c = 0;
        local_84 = bVar3;
        if ((iVar9 == 0) && (iVar6 == 0x10)) {
          local_18 = 0x1f;
          local_14 = 0x3e0;
          local_10 = 0x7c00;
          local_7c = 5;
          local_78 = 10;
          local_88 = 3;
          local_8c = 3;
          local_90 = 3;
        }
      }
      local_80 = 0;
    }
  }
  else {
    QImage::setColorCount
              ((QImage *)CONCAT44(in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58),
               (int)((ulong)in_stack_fffffffffffffe50 >> 0x20));
    local_c = 0xaaaaaaaa;
    iVar7 = 4;
    if (iVar8 == 0xc) {
      iVar7 = 3;
    }
    for (local_ac = 0; local_ac < local_9c; local_ac = local_ac + 1) {
      lVar14 = QIODevice::read((char *)pQVar12,(longlong)&local_c);
      if (lVar14 != iVar7) {
        local_2b = false;
        goto LAB_002852d4;
      }
      qRgb(local_c >> 0x10 & 0xff,local_c >> 8 & 0xff,local_c & 0xff);
      QImage::setColor((QImage *)CONCAT44(in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58),
                       (int)((ulong)in_stack_fffffffffffffe50 >> 0x20),
                       (QRgb)in_stack_fffffffffffffe50);
      uVar13 = (**(code **)(*(long *)pQVar12 + 0x90))();
      if ((uVar13 & 1) != 0) {
        local_2b = false;
        goto LAB_002852d4;
      }
    }
  }
  QImage::setDotsPerMeterX(in_stack_fffffffffffffe40,in_stack_fffffffffffffe3c);
  QImage::setDotsPerMeterY(in_stack_fffffffffffffe40,in_stack_fffffffffffffe3c);
  if (((-1 < in_RDX) && (lVar14 = (**(code **)(*(long *)pQVar12 + 0x78))(), lVar14 < in_RDX)) &&
     (uVar13 = (**(code **)(*(long *)pQVar12 + 0x60))(), (uVar13 & 1) == 0)) {
    (**(code **)(*(long *)pQVar12 + 0x88))();
  }
  qVar15 = QImage::bytesPerLine(in_R8);
  iVar8 = (int)qVar15;
  __s = QImage::bits((QImage *)CONCAT44(in_stack_fffffffffffffe3c,in_stack_fffffffffffffe38));
  if (iVar6 == 1) {
    do {
      QVar11 = (QRgb)((ulong)in_stack_fffffffffffffe40 >> 0x20);
      local_68 = local_68 + -1;
      if (local_68 < 0) break;
      lVar14 = QIODevice::read((char *)pQVar12,(longlong)(__s + local_68 * iVar8));
      QVar11 = (QRgb)((ulong)in_stack_fffffffffffffe40 >> 0x20);
    } while (lVar14 == iVar8);
    if (local_9c == 2) {
      QImage::color(in_stack_fffffffffffffe50,in_stack_fffffffffffffe4c);
      iVar9 = qGray(QVar11);
      QImage::color(in_stack_fffffffffffffe50,in_stack_fffffffffffffe4c);
      iVar6 = qGray(QVar11);
      if (iVar9 < iVar6) {
        swapPixel01(in_stack_fffffffffffffe70);
      }
    }
  }
  else if (iVar6 == 4) {
    iVar6 = (int)(uVar2 + 7) / 8 << 2;
    pbVar16 = (byte *)operator_new__((long)iVar6);
    if (iVar9 == 2) {
      local_d0 = 0;
      local_25 = 0xaa;
      puVar17 = __s + (local_68 + -1) * iVar8;
      local_e0 = puVar17;
      while ((local_d0 < local_68 &&
             (uVar13 = QIODevice::getChar((char *)pQVar12), (uVar13 & 1) != 0))) {
        if (local_25 == 0) {
          uVar13 = QIODevice::getChar((char *)pQVar12);
          if ((uVar13 & 1) == 0) {
            local_d0 = local_68;
          }
          else {
            local_d0 = local_d0 + 1;
            local_e0 = __s + ((local_68 - local_d0) + -1) * iVar8;
          }
        }
        else {
          if (puVar17 + (int)uVar2 < local_e0 + (int)(uint)local_25) {
            local_25 = (char)(puVar17 + (int)uVar2) - (char)local_e0;
          }
          QIODevice::getChar((char *)pQVar12);
          local_d8 = local_25 / 2;
          while (local_d8 != 0) {
            pbVar20 = local_e0 + 1;
            *local_e0 = (uchar)((int)(uint)local_25 >> 4);
            local_e0 = local_e0 + 2;
            *pbVar20 = local_25 & 0xf;
            local_d8 = local_d8 - 1;
          }
          if ((local_25 & 1) != 0) {
            *local_e0 = (uchar)((int)(uint)local_25 >> 4);
            local_e0 = local_e0 + 1;
          }
        }
      }
    }
    else if (iVar9 == 0) {
      memset(__s,0,(long)(local_68 * iVar8));
      while ((local_68 = local_68 + -1, -1 < local_68 &&
             (lVar14 = QIODevice::read((char *)pQVar12,(longlong)pbVar16), lVar14 == iVar6))) {
        local_f0 = __s + local_68 * iVar8;
        local_f8 = pbVar16;
        for (local_fc = 0; local_fc < (int)uVar2 / 2; local_fc = local_fc + 1) {
          pbVar20 = local_f0 + 1;
          *local_f0 = (uchar)((int)(uint)*local_f8 >> 4);
          local_f0 = local_f0 + 2;
          *pbVar20 = *local_f8 & 0xf;
          local_f8 = local_f8 + 1;
        }
        if ((uVar2 & 1) != 0) {
          *local_f0 = (uchar)((int)(uint)*local_f8 >> 4);
        }
      }
    }
    if (pbVar16 != (byte *)0x0) {
      operator_delete__(pbVar16);
    }
  }
  else if (iVar6 == 8) {
    if (iVar9 == 1) {
      local_104 = 0;
      local_28 = 0xaa;
      local_110 = __s + (local_68 + -1) * iVar8;
      puVar17 = local_110 + (int)uVar2;
      while ((local_104 < local_68 &&
             (uVar13 = QIODevice::getChar((char *)pQVar12), (uVar13 & 1) != 0))) {
        if (local_28 == 0) {
          uVar13 = QIODevice::getChar((char *)pQVar12);
          if ((uVar13 & 1) == 0) {
            local_104 = local_68;
          }
          else {
            local_104 = local_104 + 1;
            local_110 = __s + ((local_68 - local_104) + -1) * iVar8;
          }
        }
        else {
          if (puVar17 < local_110 + (int)(uint)local_28) {
            local_28 = (char)puVar17 - (char)local_110;
          }
          QIODevice::getChar((char *)pQVar12);
          memset(local_110,0xaa,(ulong)local_28);
          local_110 = local_110 + (int)(uint)local_28;
        }
      }
    }
    else if (iVar9 == 0) {
      do {
        local_68 = local_68 + -1;
        if (local_68 < 0) break;
        lVar14 = QIODevice::read((char *)pQVar12,(longlong)(__s + local_68 * iVar8));
      } while (lVar14 == iVar8);
    }
  }
  else if (((iVar6 == 0x10) || (iVar6 == 0x18)) || (iVar6 == 0x20)) {
    puVar18 = (ushort *)operator_new__((long)iVar8);
    iVar9 = (int)(uVar2 * iVar6 + 0x1f) / 0x20 << 2;
    while (local_68 = local_68 + -1, -1 < local_68) {
      local_120 = (QRgb *)(__s + local_68 * iVar8);
      pQVar19 = local_120 + (int)uVar2;
      lVar14 = QIODevice::read((char *)pQVar12,(longlong)puVar18);
      local_140 = puVar18;
      if (lVar14 != iVar9) break;
      while (local_120 < pQVar19) {
        local_144 = (uint)*local_140;
        if (0x10 < iVar6) {
          local_144 = (uint)CONCAT12((char)local_140[1],*local_140);
        }
        if (0x18 < iVar6) {
          local_144 = (uint)*(byte *)((long)local_140 + 3) << 0x18 | local_144;
        }
        uVar10 = apply_scale((local_144 & local_10) >> (local_78 & 0x1f),local_88);
        g = apply_scale((local_144 & local_14) >> (local_7c & 0x1f),local_8c);
        b_00 = apply_scale((local_144 & local_18) >> (local_80 & 0x1f),local_90);
        if (bVar23 && bVar24) {
          a = apply_scale((local_144 & local_1c) >> (local_84 & 0x1f),local_94);
        }
        else {
          a = 0xff;
        }
        QVar11 = qRgba(uVar10,g,b_00,a);
        *local_120 = QVar11;
        local_140 = (ushort *)((long)local_140 + (long)(iVar6 / 8));
        local_120 = local_120 + 1;
      }
    }
    if (puVar18 != (ushort *)0x0) {
      operator_delete__(puVar18);
    }
  }
  if (in_RSI[2] < 0) {
    __dest = operator_new__((long)iVar8);
    iVar9 = -in_RSI[2];
    for (local_154 = 0; local_154 < iVar9 / 2; local_154 = local_154 + 1) {
      memcpy(__dest,__s + local_154 * iVar8,(long)iVar8);
      memcpy(__s + local_154 * iVar8,__s + ((iVar9 - local_154) + -1) * iVar8,(long)iVar8);
      memcpy(__s + ((iVar9 - local_154) + -1) * iVar8,__dest,(long)iVar8);
    }
    if (__dest != (void *)0x0) {
      operator_delete__(__dest);
    }
  }
  local_2b = true;
LAB_002852d4:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return local_2b;
}

Assistant:

static bool read_dib_body(QDataStream &s, const BMP_INFOHDR &bi, qint64 datapos, qint64 startpos, QImage &image)
{
    QIODevice* d = s.device();
    if (d->atEnd())                                // end of stream/file
        return false;
#if 0
    qDebug("offset...........%lld", datapos);
    qDebug("startpos.........%lld", startpos);
    qDebug("biSize...........%d", bi.biSize);
    qDebug("biWidth..........%d", bi.biWidth);
    qDebug("biHeight.........%d", bi.biHeight);
    qDebug("biPlanes.........%d", bi.biPlanes);
    qDebug("biBitCount.......%d", bi.biBitCount);
    qDebug("biCompression....%d", bi.biCompression);
    qDebug("biSizeImage......%d", bi.biSizeImage);
    qDebug("biXPelsPerMeter..%d", bi.biXPelsPerMeter);
    qDebug("biYPelsPerMeter..%d", bi.biYPelsPerMeter);
    qDebug("biClrUsed........%d", bi.biClrUsed);
    qDebug("biClrImportant...%d", bi.biClrImportant);
#endif
    int w = bi.biWidth,         h = bi.biHeight,  nbits = bi.biBitCount;
    int t = bi.biSize,         comp = bi.biCompression;
    uint red_mask = 0;
    uint green_mask = 0;
    uint blue_mask = 0;
    uint alpha_mask = 0;
    uint red_shift = 0;
    uint green_shift = 0;
    uint blue_shift = 0;
    uint alpha_shift = 0;
    uint red_scale = 0;
    uint green_scale = 0;
    uint blue_scale = 0;
    uint alpha_scale = 0;
    bool bitfields = comp == BMP_BITFIELDS || comp == BMP_ALPHABITFIELDS;

    if (!d->isSequential())
        d->seek(startpos + bi.biSize); // goto start of colormap or masks

    if (bi.biSize >= BMP_WIN4) {
        red_mask = bi.biRedMask;
        green_mask = bi.biGreenMask;
        blue_mask = bi.biBlueMask;
        alpha_mask = bi.biAlphaMask;
    } else if (bitfields && (nbits == 16 || nbits == 32)) {
        if (d->read((char *)&red_mask, sizeof(red_mask)) != sizeof(red_mask))
            return false;
        if (d->read((char *)&green_mask, sizeof(green_mask)) != sizeof(green_mask))
            return false;
        if (d->read((char *)&blue_mask, sizeof(blue_mask)) != sizeof(blue_mask))
            return false;
        if (comp == BMP_ALPHABITFIELDS && d->read((char *)&alpha_mask, sizeof(alpha_mask)) != sizeof(alpha_mask))
            return false;
    }

    bool transp = bitfields || (comp == BMP_RGB && nbits == 32 && alpha_mask == 0xff000000);
    transp = transp && alpha_mask;

    int ncols = 0;
    int depth = 0;
    QImage::Format format;
    switch (nbits) {
        case 32:
        case 24:
        case 16:
            depth = 32;
            format = transp ? QImage::Format_ARGB32 : QImage::Format_RGB32;
            break;
        case 8:
        case 4:
            depth = 8;
            format = QImage::Format_Indexed8;
            break;
        case 1:
            depth = 1;
            format = QImage::Format_Mono;
            break;
        default:
            return false;
            break;
    }

    if (depth != 32) {
        ncols = bi.biClrUsed ? bi.biClrUsed : 1 << nbits;
        if (ncols < 1 || ncols > 256) // sanity check - don't run out of mem if color table is broken
            return false;
    }

    if (bi.biHeight < 0)
        h = -h;                  // support images with negative height

    if (!QImageIOHandler::allocateImage(QSize(w, h), format, &image))
        return false;
    if (ncols > 0) {                                // read color table
        image.setColorCount(ncols);
        uchar rgb[4];
        int   rgb_len = t == BMP_OLD ? 3 : 4;
        for (int i=0; i<ncols; i++) {
            if (d->read((char *)rgb, rgb_len) != rgb_len)
                return false;
            image.setColor(i, qRgb(rgb[2],rgb[1],rgb[0]));
            if (d->atEnd())                        // truncated file
                return false;
        }
    } else if (bitfields && (nbits == 16 || nbits == 32)) {
        red_shift = calc_shift(red_mask);
        if (((red_mask >> red_shift) + 1) == 0)
            return false;
        red_scale = calc_scale(red_mask >> red_shift);
        green_shift = calc_shift(green_mask);
        if (((green_mask >> green_shift) + 1) == 0)
            return false;
        green_scale = calc_scale(green_mask >> green_shift);
        blue_shift = calc_shift(blue_mask);
        if (((blue_mask >> blue_shift) + 1) == 0)
            return false;
        blue_scale = calc_scale(blue_mask >> blue_shift);
        alpha_shift = calc_shift(alpha_mask);
        if (((alpha_mask >> alpha_shift) + 1) == 0)
            return false;
        alpha_scale = calc_scale(alpha_mask >> alpha_shift);
    } else if (comp == BMP_RGB && (nbits == 24 || nbits == 32)) {
        blue_mask = 0x000000ff;
        green_mask = 0x0000ff00;
        red_mask = 0x00ff0000;
        blue_shift = 0;
        green_shift = 8;
        red_shift = 16;
        blue_scale = green_scale = red_scale = 0;
        if (transp) {
            alpha_shift = calc_shift(alpha_mask);
            if (((alpha_mask >> alpha_shift) + 1) == 0)
                return false;
            alpha_scale = calc_scale(alpha_mask >> alpha_shift);
        }
    } else if (comp == BMP_RGB && nbits == 16) {
        blue_mask = 0x001f;
        green_mask = 0x03e0;
        red_mask = 0x7c00;
        blue_shift = 0;
        green_shift = 5;
        red_shift = 10;
        blue_scale = green_scale = red_scale = 3;
    }

    image.setDotsPerMeterX(bi.biXPelsPerMeter);
    image.setDotsPerMeterY(bi.biYPelsPerMeter);

#if 0
    qDebug("Rmask: %08x Rshift: %08x Rscale:%08x", red_mask, red_shift, red_scale);
    qDebug("Gmask: %08x Gshift: %08x Gscale:%08x", green_mask, green_shift, green_scale);
    qDebug("Bmask: %08x Bshift: %08x Bscale:%08x", blue_mask, blue_shift, blue_scale);
    qDebug("Amask: %08x Ashift: %08x Ascale:%08x", alpha_mask, alpha_shift, alpha_scale);
#endif

    if (datapos >= 0 && datapos > d->pos()) {
        if (!d->isSequential())
            d->seek(datapos); // start of image data
    }

    int             bpl = image.bytesPerLine();
    uchar *data = image.bits();

    if (nbits == 1) {                                // 1 bit BMP image
        while (--h >= 0) {
            if (d->read((char*)(data + h*bpl), bpl) != bpl)
                break;
        }
        if (ncols == 2 && qGray(image.color(0)) < qGray(image.color(1)))
            swapPixel01(&image);                // pixel 0 is white!
    }

    else if (nbits == 4) {                        // 4 bit BMP image
        int    buflen = ((w+7)/8)*4;
        uchar *buf    = new uchar[buflen];
        if (comp == BMP_RLE4) {                // run length compression
            int x=0, y=0, c, i;
            quint8 b;
            uchar *p = data + (h-1)*bpl;
            const uchar *endp = p + w;
            while (y < h) {
                if (!d->getChar((char *)&b))
                    break;
                if (b == 0) {                        // escape code
                    if (!d->getChar((char *)&b) || b == 1) {
                        y = h;                // exit loop
                    } else switch (b) {
                        case 0:                        // end of line
                            x = 0;
                            y++;
                            p = data + (h-y-1)*bpl;
                            break;
                        case 2:                        // delta (jump)
                        {
                            quint8 tmp;
                            d->getChar((char *)&tmp);
                            x += tmp;
                            d->getChar((char *)&tmp);
                            y += tmp;
                        }

                            // Protection
                            if ((uint)x >= (uint)w)
                                x = w-1;
                            if ((uint)y >= (uint)h)
                                y = h-1;

                            p = data + (h-y-1)*bpl + x;
                            break;
                        default:                // absolute mode
                            // Protection
                            if (p + b > endp)
                                b = endp-p;

                            i = (c = b)/2;
                            while (i--) {
                                d->getChar((char *)&b);
                                *p++ = b >> 4;
                                *p++ = b & 0x0f;
                            }
                            if (c & 1) {
                                unsigned char tmp;
                                d->getChar((char *)&tmp);
                                *p++ = tmp >> 4;
                            }
                            if ((((c & 3) + 1) & 2) == 2)
                                d->getChar(nullptr);        // align on word boundary
                            x += c;
                    }
                } else {                        // encoded mode
                    // Protection
                    if (p + b > endp)
                        b = endp-p;

                    i = (c = b)/2;
                    d->getChar((char *)&b);                // 2 pixels to be repeated
                    while (i--) {
                        *p++ = b >> 4;
                        *p++ = b & 0x0f;
                    }
                    if (c & 1)
                        *p++ = b >> 4;
                    x += c;
                }
            }
        } else if (comp == BMP_RGB) {                // no compression
            memset(data, 0, h*bpl);
            while (--h >= 0) {
                if (d->read((char*)buf,buflen) != buflen)
                    break;
                uchar *p = data + h*bpl;
                uchar *b = buf;
                for (int i=0; i<w/2; i++) {        // convert nibbles to bytes
                    *p++ = *b >> 4;
                    *p++ = *b++ & 0x0f;
                }
                if (w & 1)                        // the last nibble
                    *p = *b >> 4;
            }
        }
        delete [] buf;
    }

    else if (nbits == 8) {                        // 8 bit BMP image
        if (comp == BMP_RLE8) {                // run length compression
            int x=0, y=0;
            quint8 b;
            uchar *p = data + (h-1)*bpl;
            const uchar *endp = p + w;
            while (y < h) {
                if (!d->getChar((char *)&b))
                    break;
                if (b == 0) {                        // escape code
                    if (!d->getChar((char *)&b) || b == 1) {
                            y = h;                // exit loop
                    } else switch (b) {
                        case 0:                        // end of line
                            x = 0;
                            y++;
                            p = data + (h-y-1)*bpl;
                            break;
                        case 2:                        // delta (jump)
                            {
                                quint8 tmp;
                                d->getChar((char *)&tmp);
                                x += tmp;
                                d->getChar((char *)&tmp);
                                y += tmp;
                            }

                            // Protection
                            if ((uint)x >= (uint)w)
                                x = w-1;
                            if ((uint)y >= (uint)h)
                                y = h-1;

                            p = data + (h-y-1)*bpl + x;
                            break;
                        default:                // absolute mode
                            // Protection
                            if (p + b > endp)
                                b = endp-p;

                            if (d->read((char *)p, b) != b)
                                return false;
                            if ((b & 1) == 1)
                                d->getChar(nullptr);        // align on word boundary
                            x += b;
                            p += b;
                    }
                } else {                        // encoded mode
                    // Protection
                    if (p + b > endp)
                        b = endp-p;

                    char tmp;
                    d->getChar(&tmp);
                    memset(p, tmp, b); // repeat pixel
                    x += b;
                    p += b;
                }
            }
        } else if (comp == BMP_RGB) {                // uncompressed
            while (--h >= 0) {
                if (d->read((char *)data + h*bpl, bpl) != bpl)
                    break;
            }
        }
    }

    else if (nbits == 16 || nbits == 24 || nbits == 32) { // 16,24,32 bit BMP image
        QRgb *p;
        QRgb  *end;
        uchar *buf24 = new uchar[bpl];
        int    bpl24 = ((w*nbits+31)/32)*4;
        uchar *b;
        int c;

        while (--h >= 0) {
            p = (QRgb *)(data + h*bpl);
            end = p + w;
            if (d->read((char *)buf24,bpl24) != bpl24)
                break;
            b = buf24;
            while (p < end) {
                c = *(uchar*)b | (*(uchar*)(b+1)<<8);
                if (nbits > 16)
                    c |= *(uchar*)(b+2)<<16;
                if (nbits > 24)
                    c |= *(uchar*)(b+3)<<24;
                *p++ = qRgba(apply_scale((c & red_mask) >> red_shift, red_scale),
                             apply_scale((c & green_mask) >> green_shift, green_scale),
                             apply_scale((c & blue_mask) >> blue_shift, blue_scale),
                             transp ? apply_scale((c & alpha_mask) >> alpha_shift, alpha_scale) : 0xff);
                b += nbits/8;
            }
        }
        delete[] buf24;
    }

    if (bi.biHeight < 0) {
        // Flip the image
        uchar *buf = new uchar[bpl];
        h = -bi.biHeight;
        for (int y = 0; y < h/2; ++y) {
            memcpy(buf, data + y*bpl, bpl);
            memcpy(data + y*bpl, data + (h-y-1)*bpl, bpl);
            memcpy(data + (h-y-1)*bpl, buf, bpl);
        }
        delete [] buf;
    }

    return true;
}